

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O3

int poll_add(event_base *base,int fd,short old,short events,void *idx_)

{
  int iVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  
  if ((events & 8U) != 0) {
    poll_add_cold_1();
  }
  if ((events & 6U) != 0) {
    piVar3 = (int *)base->evbase;
    iVar1 = *piVar3;
    if (iVar1 <= piVar3[1] + 1) {
      uVar5 = 0x20;
      if (0x1f < iVar1) {
        uVar5 = (ulong)(uint)(iVar1 * 2);
      }
      pvVar2 = event_mm_realloc_(*(void **)(piVar3 + 4),uVar5 * 8);
      if (pvVar2 == (void *)0x0) {
        event_warn("realloc");
        return -1;
      }
      *(void **)(piVar3 + 4) = pvVar2;
      *piVar3 = (int)uVar5;
      piVar3[2] = 1;
    }
    if ((long)*idx_ < 1) {
      iVar1 = piVar3[1];
      iVar4 = iVar1 + 1;
      piVar3[1] = iVar4;
      piVar3 = (int *)(*(long *)(piVar3 + 4) + (long)iVar1 * 8);
      *(undefined2 *)(piVar3 + 1) = 0;
      *piVar3 = fd;
      *(int *)idx_ = iVar4;
    }
    else {
      piVar3 = (int *)(*(long *)(piVar3 + 4) + (long)*idx_ * 8 + -8);
    }
    *(undefined2 *)((long)piVar3 + 6) = 0;
    if ((events & 4U) != 0) {
      *(byte *)(piVar3 + 1) = *(byte *)(piVar3 + 1) | 4;
    }
    if ((events & 2U) != 0) {
      *(byte *)(piVar3 + 1) = *(byte *)(piVar3 + 1) | 1;
    }
  }
  return 0;
}

Assistant:

static int
poll_add(struct event_base *base, int fd, short old, short events, void *idx_)
{
	struct pollop *pop = base->evbase;
	struct pollfd *pfd = NULL;
	struct pollidx *idx = idx_;
	int i;

	EVUTIL_ASSERT((events & EV_SIGNAL) == 0);
	if (!(events & (EV_READ|EV_WRITE)))
		return (0);

	poll_check_ok(pop);
	if (pop->nfds + 1 >= pop->event_count) {
		struct pollfd *tmp_event_set;
		int tmp_event_count;

		if (pop->event_count < 32)
			tmp_event_count = 32;
		else
			tmp_event_count = pop->event_count * 2;

		/* We need more file descriptors */
		tmp_event_set = mm_realloc(pop->event_set,
				 tmp_event_count * sizeof(struct pollfd));
		if (tmp_event_set == NULL) {
			event_warn("realloc");
			return (-1);
		}
		pop->event_set = tmp_event_set;

		pop->event_count = tmp_event_count;
		pop->realloc_copy = 1;
	}

	i = idx->idxplus1 - 1;

	if (i >= 0) {
		pfd = &pop->event_set[i];
	} else {
		i = pop->nfds++;
		pfd = &pop->event_set[i];
		pfd->events = 0;
		pfd->fd = fd;
		idx->idxplus1 = i + 1;
	}

	pfd->revents = 0;
	if (events & EV_WRITE)
		pfd->events |= POLLOUT;
	if (events & EV_READ)
		pfd->events |= POLLIN;
	poll_check_ok(pop);

	return (0);
}